

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# higher_order_functions.c
# Opt level: O3

int zip_add_min_dispatcher(int *a,int *b,int size)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  vrna_cpu_simd_capabilities();
  fun_zip_add_min = fun_zip_add_min_default;
  if (size < 1) {
    iVar1 = 10000000;
  }
  else {
    iVar1 = 10000000;
    uVar2 = 0;
    do {
      if (((a[uVar2] != 10000000) && (b[uVar2] != 10000000)) &&
         (iVar3 = b[uVar2] + a[uVar2], iVar3 <= iVar1)) {
        iVar1 = iVar3;
      }
      uVar2 = uVar2 + 1;
    } while ((uint)size != uVar2);
  }
  return iVar1;
}

Assistant:

static int
zip_add_min_dispatcher(const int  *a,
                       const int  *b,
                       int        size)
{
  unsigned int features = vrna_cpu_simd_capabilities();

#if VRNA_WITH_SIMD_AVX512
  if (features & VRNA_CPU_SIMD_AVX512F) {
    fun_zip_add_min = &vrna_fun_zip_add_min_avx512;
    goto exec_fun_zip_add_min;
  }

#endif

#if VRNA_WITH_SIMD_SSE41
  if (features & VRNA_CPU_SIMD_SSE41) {
    fun_zip_add_min = &vrna_fun_zip_add_min_sse41;
    goto exec_fun_zip_add_min;
  }

#endif

  fun_zip_add_min = &fun_zip_add_min_default;

exec_fun_zip_add_min:

  return (*fun_zip_add_min)(a, b, size);
}